

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::arraySizesCheck
          (TParseContext *this,TSourceLoc *loc,TQualifier *qualifier,TArraySizes *arraySizes,
          TIntermTyped *initializer,bool lastMember)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  ulong uVar4;
  bool lastMember_local;
  TIntermTyped *initializer_local;
  TArraySizes *arraySizes_local;
  TQualifier *qualifier_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  if (arraySizes == (TArraySizes *)0x0) {
    __assert_fail("arraySizes",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                  ,0x132d,
                  "void glslang::TParseContext::arraySizesCheck(const TSourceLoc &, const TQualifier &, TArraySizes *, const TIntermTyped *, bool)"
                 );
  }
  if (((this->super_TParseContextBase).parsingBuiltins & 1U) != 0) {
    return;
  }
  if (initializer != (TIntermTyped *)0x0) {
    iVar2 = (*(initializer->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    uVar4 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0xf8))();
    if ((uVar4 & 1) == 0) {
      return;
    }
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"array initializer must be sized","[]","");
    return;
  }
  bVar1 = TArraySizes::isInnerUnsized(arraySizes);
  if (bVar1) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"only outermost dimension of an array of arrays can be implicitly sized",
               "[]","");
    TArraySizes::clearInnerUnsized(arraySizes);
  }
  bVar1 = TArraySizes::isInnerSpecialization(arraySizes);
  if ((((bVar1) && ((*(ulong *)&qualifier->field_0x8 & 0x7f) != 0)) &&
      (((uint)*(undefined8 *)&qualifier->field_0x8 & 0x7f) != 1)) &&
     ((((uint)*(undefined8 *)&qualifier->field_0x8 & 0x7f) != 7 &&
      (((uint)*(undefined8 *)&qualifier->field_0x8 & 0x7f) != 2)))) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,
               "only outermost dimension of an array of arrays can be a specialization constant",
               "[]","");
  }
  bVar1 = TParseVersions::isEsProfile((TParseVersions *)this);
  if (!bVar1) {
    return;
  }
  switch((this->super_TParseContextBase).super_TParseVersions.language) {
  case EShLangTessControl:
    if ((((uint)*(undefined8 *)&qualifier->field_0x8 & 0x7f) != 3) &&
       ((((uint)*(undefined8 *)&qualifier->field_0x8 & 0x7f) != 4 ||
        (bVar1 = TQualifier::isPatch(qualifier), bVar1)))) goto LAB_0076639d;
    bVar1 = TParseVersions::isEsProfile((TParseVersions *)this);
    if ((bVar1) && (0x13f < (this->super_TParseContextBase).super_TParseVersions.version)) {
      return;
    }
    uVar3 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[9])
                      (this,2,AEP_tessellation_shader);
    break;
  case EShLangTessEvaluation:
    if (((((uint)*(undefined8 *)&qualifier->field_0x8 & 0x7f) != 3) ||
        (bVar1 = TQualifier::isPatch(qualifier), bVar1)) &&
       (((uint)*(undefined8 *)&qualifier->field_0x8 & 0x7f) != 4)) goto LAB_0076639d;
    bVar1 = TParseVersions::isEsProfile((TParseVersions *)this);
    if ((bVar1) && (0x13f < (this->super_TParseContextBase).super_TParseVersions.version)) {
      return;
    }
    uVar3 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[9])
                      (this,2,AEP_tessellation_shader);
    break;
  case EShLangGeometry:
    if (((uint)*(undefined8 *)&qualifier->field_0x8 & 0x7f) != 3) goto LAB_0076639d;
    bVar1 = TParseVersions::isEsProfile((TParseVersions *)this);
    if ((bVar1) && (0x13f < (this->super_TParseContextBase).super_TParseVersions.version)) {
      return;
    }
    uVar3 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[9])
                      (this,2,AEP_geometry_shader);
    break;
  default:
    goto LAB_0076639d;
  case EShLangMesh:
    if (((uint)*(undefined8 *)&qualifier->field_0x8 & 0x7f) != 4) goto LAB_0076639d;
    bVar1 = TParseVersions::isEsProfile((TParseVersions *)this);
    if ((bVar1) && (0x13f < (this->super_TParseContextBase).super_TParseVersions.version)) {
      return;
    }
    uVar3 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[9])
                      (this,2,AEP_mesh_shader);
  }
  if ((uVar3 & 1) != 0) {
    return;
  }
LAB_0076639d:
  if ((((uint)*(undefined8 *)&qualifier->field_0x8 & 0x7f) != 6) || (!lastMember)) {
    arraySizeRequiredCheck(this,loc,arraySizes);
  }
  return;
}

Assistant:

void TParseContext::arraySizesCheck(const TSourceLoc& loc, const TQualifier& qualifier, TArraySizes* arraySizes,
    const TIntermTyped* initializer, bool lastMember)
{
    assert(arraySizes);

    // always allow special built-in ins/outs sized to topologies
    if (parsingBuiltins)
        return;

    // initializer must be a sized array, in which case
    // allow the initializer to set any unknown array sizes
    if (initializer != nullptr) {
        if (initializer->getType().isUnsizedArray())
            error(loc, "array initializer must be sized", "[]", "");
        return;
    }

    // No environment allows any non-outer-dimension to be implicitly sized
    if (arraySizes->isInnerUnsized()) {
        error(loc, "only outermost dimension of an array of arrays can be implicitly sized", "[]", "");
        arraySizes->clearInnerUnsized();
    }

    if (arraySizes->isInnerSpecialization() &&
        (qualifier.storage != EvqTemporary && qualifier.storage != EvqGlobal && qualifier.storage != EvqShared && qualifier.storage != EvqConst))
        error(loc, "only outermost dimension of an array of arrays can be a specialization constant", "[]", "");

    // desktop always allows outer-dimension-unsized variable arrays,
    if (!isEsProfile())
        return;

    // for ES, if size isn't coming from an initializer, it has to be explicitly declared now,
    // with very few exceptions

    // implicitly-sized io exceptions:
    switch (language) {
    case EShLangGeometry:
        if (qualifier.storage == EvqVaryingIn)
            if ((isEsProfile() && version >= 320) ||
                extensionsTurnedOn(Num_AEP_geometry_shader, AEP_geometry_shader))
                return;
        break;
    case EShLangTessControl:
        if ( qualifier.storage == EvqVaryingIn ||
            (qualifier.storage == EvqVaryingOut && ! qualifier.isPatch()))
            if ((isEsProfile() && version >= 320) ||
                extensionsTurnedOn(Num_AEP_tessellation_shader, AEP_tessellation_shader))
                return;
        break;
    case EShLangTessEvaluation:
        if ((qualifier.storage == EvqVaryingIn && ! qualifier.isPatch()) ||
             qualifier.storage == EvqVaryingOut)
            if ((isEsProfile() && version >= 320) ||
                extensionsTurnedOn(Num_AEP_tessellation_shader, AEP_tessellation_shader))
                return;
        break;
    case EShLangMesh:
        if (qualifier.storage == EvqVaryingOut)
            if ((isEsProfile() && version >= 320) ||
                extensionsTurnedOn(Num_AEP_mesh_shader, AEP_mesh_shader))
                return;
        break;
    default:
        break;
    }

    // last member of ssbo block exception:
    if (qualifier.storage == EvqBuffer && lastMember)
        return;

    arraySizeRequiredCheck(loc, *arraySizes);
}